

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool CheckBlockHeader(CBlockHeader *block,BlockValidationState *state,Params *consensusParams,
                     bool fCheckPOW)

{
  uint256 hash;
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70;
  uint256 local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if ((int)CONCAT71(in_register_00000009,fCheckPOW) != 0) {
    CBlockHeader::GetHash(&local_50,block);
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_50.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_50.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_50.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_50.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_50.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_50.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_50.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_50.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_50.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_50.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_50.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_50.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_50.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_50.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_50.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_50.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x10];
    hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x11];
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x12];
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x13];
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x14];
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x15];
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x16];
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x17];
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x18];
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x19];
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_50.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar1 = CheckProofOfWork(hash,block->nBits,consensusParams);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"high-hash",&local_91);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"proof of work failed",&local_92);
      bVar2 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_HEADER,
                         &local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckBlockHeader(const CBlockHeader& block, BlockValidationState& state, const Consensus::Params& consensusParams, bool fCheckPOW = true)
{
    // Check proof of work matches claimed amount
    if (fCheckPOW && !CheckProofOfWork(block.GetHash(), block.nBits, consensusParams))
        return state.Invalid(BlockValidationResult::BLOCK_INVALID_HEADER, "high-hash", "proof of work failed");

    return true;
}